

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmuse(mcmcx1def *ctx,mcmon obj)

{
  mcmodef *pmVar1;
  uint uVar2;
  ushort in_SI;
  mcmcx1def *in_RDI;
  mcmodef *o;
  
  pmVar1 = in_RDI->mcmcxtab[(int)(uint)in_SI >> 8];
  uVar2 = in_SI & 0xff;
  if (in_RDI->mcmcxmru != in_SI) {
    if ((pmVar1[(int)uVar2].mcmoflg & 0x10) != 0) {
      mcmunl(in_RDI,in_SI,&in_RDI->mcmcxlru);
    }
    if (in_RDI->mcmcxmru != 0xffff) {
      in_RDI->mcmcxtab[(int)(uint)in_RDI->mcmcxmru >> 8][(int)(in_RDI->mcmcxmru & 0xff)].mcmonxt =
           in_SI;
    }
    pmVar1[(int)uVar2].mcmoprv = in_RDI->mcmcxmru;
    pmVar1[(int)uVar2].mcmonxt = 0xffff;
    in_RDI->mcmcxmru = in_SI;
    if (in_RDI->mcmcxlru == 0xffff) {
      in_RDI->mcmcxlru = in_SI;
    }
    pmVar1[(int)uVar2].mcmoflg = pmVar1[(int)uVar2].mcmoflg | 0x10;
  }
  return;
}

Assistant:

void mcmuse(mcmcx1def *ctx, mcmon obj)
{
    mcmodef   *o = mcmgobje(ctx, obj);
    
    MCMGLBCTX(ctx);

    if (ctx->mcmcxmru == obj) return;         /* already MRU; nothing to do */
    
    /* remove from LRU chain if it's in it */
    if (o->mcmoflg & MCMOFLRU) mcmunl(ctx, obj, &ctx->mcmcxlru);

    /* set forward pointer of last block, if there is one */
    if (ctx->mcmcxmru != MCMONINV)
        mcmgobje(ctx, ctx->mcmcxmru)->mcmonxt = obj;
    
    o->mcmoprv = ctx->mcmcxmru;               /* point back to previous MRU */
    o->mcmonxt = MCMONINV;                /* nothing in list after this one */
    ctx->mcmcxmru = obj;                          /* point MRU to new block */
    
    /* if there's nothing in the chain at all, set LRU to this block, too */
    if (ctx->mcmcxlru == MCMONINV) ctx->mcmcxlru = obj;

    /* note that object is in LRU chain */
    o->mcmoflg |= MCMOFLRU;
}